

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O2

void __thiscall
xray_re::xr_partition::load_0(xr_partition *this,xr_reader *r,xr_bone_vec *all_bones)

{
  uint *puVar1;
  const_reference ppxVar2;
  ulong uVar3;
  bool bVar4;
  
  xr_reader::r_sz(r,&this->m_name);
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  uVar3 = (ulong)*puVar1;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    puVar1 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
    ppxVar2 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::at
                        (all_bones,(ulong)*puVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_bones,&(*ppxVar2)->m_name);
  }
  return;
}

Assistant:

void xr_partition::load_0(xr_reader& r, const xr_bone_vec& all_bones)
{
	r.r_sz(m_name);
	for (uint_fast32_t n = r.r_u32(); n; --n)
		m_bones.push_back(all_bones.at(r.r_u32())->name());
}